

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

Box<float> __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::computeBox(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
             *this,Box<float> *box,int i)

{
  Vector2<float> local_5c;
  Vector2<float> local_54;
  Vector2<float> local_4c;
  Vector2<float> local_44;
  Vector2<float> local_3c;
  Vector2<float> childSize;
  Vector2<float> origin;
  int i_local;
  Box<float> *box_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  childSize = Box<float>::getTopLeft(box);
  local_44 = Box<float>::getSize(box);
  local_3c = operator/(local_44,2.0);
  switch(i) {
  case 0:
    Box<float>::Box((Box<float> *)&this_local,&childSize,&local_3c);
    break;
  case 1:
    Vector2<float>::Vector2(&local_4c,childSize.x + local_3c.x,childSize.y);
    Box<float>::Box((Box<float> *)&this_local,&local_4c,&local_3c);
    break;
  case 2:
    Vector2<float>::Vector2(&local_54,childSize.x,childSize.y + local_3c.y);
    Box<float>::Box((Box<float> *)&this_local,&local_54,&local_3c);
    break;
  case 3:
    local_5c = operator+(childSize,&local_3c);
    Box<float>::Box((Box<float> *)&this_local,&local_5c,&local_3c);
    break;
  default:
    Box<float>::Box((Box<float> *)&this_local,0.0,0.0,0.0,0.0);
  }
  return _this_local;
}

Assistant:

Box<Float> computeBox(const Box<Float>& box, int i) const
    {
        auto origin = box.getTopLeft();
        auto childSize = box.getSize() / static_cast<Float>(2);
        switch (i)
        {
            // North West
            case 0:
                return Box<Float>(origin, childSize);
            // Norst East
            case 1:
                return Box<Float>(Vector2<Float>(origin.x + childSize.x, origin.y), childSize);
            // South West
            case 2:
                return Box<Float>(Vector2<Float>(origin.x, origin.y + childSize.y), childSize);
            // South East
            case 3:
                return Box<Float>(origin + childSize, childSize);
            default:
                assert(false && "Invalid child index");
                return Box<Float>();
        }
    }